

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_netinfo.cpp
# Opt level: O2

void UpdateTeam(int pnum,int team,bool update)

{
  bool bVar1;
  uint uVar2;
  uint uiTeam;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  FBaseCVar **ppFVar6;
  TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_> *this;
  FName local_34;
  
  this = (TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_> *)
         (&DAT_017dbfb8 + (long)pnum * 0x2a0);
  if ((((byte)dmflags2.Value & 0x10) != 0) &&
     ((alwaysapplydmflags.Value || (deathmatch.Value != 0)))) {
    uVar2 = userinfo_t::GetTeam((userinfo_t *)this);
    bVar1 = FTeam::IsValidTeam(&TeamLibrary,uVar2);
    if (bVar1) {
      Printf("Team changing has been disabled!\n");
      return;
    }
  }
  bVar1 = FTeam::IsValidTeam(&TeamLibrary,team);
  iVar3 = 0xff;
  if (bVar1) {
    iVar3 = team;
  }
  uVar2 = userinfo_t::GetTeam((userinfo_t *)this);
  uiTeam = userinfo_t::TeamChanged((userinfo_t *)this,iVar3);
  if (update && uVar2 != uiTeam) {
    bVar1 = FTeam::IsValidTeam(&TeamLibrary,uiTeam);
    pcVar4 = userinfo_t::GetName((userinfo_t *)this);
    if (bVar1) {
      pcVar5 = FTeam::GetName(Teams.Array + (int)uiTeam);
      Printf("%s joined the %s team\n",pcVar4,pcVar5);
    }
    else {
      Printf("%s is now a loner\n",pcVar4);
    }
  }
  R_BuildPlayerTranslation(pnum);
  if (StatusBar != (DBaseStatusBar *)0x0) {
    iVar3 = DBaseStatusBar::GetPlayer(StatusBar);
    if (iVar3 == pnum) {
      (*(StatusBar->super_DObject)._vptr_DObject[10])(StatusBar,&players + (long)pnum * 0x54);
    }
  }
  bVar1 = FTeam::IsValidTeam(&TeamLibrary,uiTeam);
  if (!bVar1) {
    local_34.Index = 0x203;
    ppFVar6 = TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>::operator[]
                        (this,&local_34);
    FIntCVar::operator=((FIntCVar *)*ppFVar6,0xff);
  }
  return;
}

Assistant:

static void UpdateTeam (int pnum, int team, bool update)
{
	userinfo_t *info = &players[pnum].userinfo;

	if ((dmflags2 & DF2_NO_TEAM_SWITCH) && (alwaysapplydmflags || deathmatch) && TeamLibrary.IsValidTeam (info->GetTeam()))
	{
		Printf ("Team changing has been disabled!\n");
		return;
	}

	int oldteam;

	if (!TeamLibrary.IsValidTeam (team))
	{
		team = TEAM_NONE;
	}
	oldteam = info->GetTeam();
	team = info->TeamChanged(team);

	if (update && oldteam != team)
	{
		if (TeamLibrary.IsValidTeam (team))
			Printf ("%s joined the %s team\n", info->GetName(), Teams[team].GetName ());
		else
			Printf ("%s is now a loner\n", info->GetName());
	}
	// Let the player take on the team's color
	R_BuildPlayerTranslation (pnum);
	if (StatusBar != NULL && StatusBar->GetPlayer() == pnum)
	{
		StatusBar->AttachToPlayer (&players[pnum]);
	}
	// Double-check
	if (!TeamLibrary.IsValidTeam (team))
	{
		*static_cast<FIntCVar *>((*info)[NAME_Team]) = TEAM_NONE;
	}
}